

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

string * __thiscall Assimp::FIShortValueImpl::toString_abi_cxx11_(FIShortValueImpl *this)

{
  anon_class_16_2_7fa2732d __f;
  int n;
  ostringstream os;
  int local_1ac;
  long *local_1a8 [2];
  long local_198 [2];
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  if (this->strValueValid == false) {
    this->strValueValid = true;
    std::__cxx11::ostringstream::ostringstream(local_188);
    local_1ac = 0;
    __f.os = (ostringstream *)local_188;
    __f.n = &local_1ac;
    std::
    for_each<__gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>,Assimp::FIShortValueImpl::toString[abi:cxx11]()const::_lambda(short)_1_>
              ((__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>)
               (this->super_FIShortValue).value.super__Vector_base<short,_std::allocator<short>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>)
               (this->super_FIShortValue).value.super__Vector_base<short,_std::allocator<short>_>.
               _M_impl.super__Vector_impl_data._M_finish,__f);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->strValue,(string *)local_1a8);
    if (local_1a8[0] != local_198) {
      operator_delete(local_1a8[0],local_198[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_188);
    std::ios_base::~ios_base(local_118);
  }
  return &this->strValue;
}

Assistant:

virtual const std::string &toString() const /*override*/ {
        if (!strValueValid) {
            strValueValid = true;
            std::ostringstream os;
            int n = 0;
            std::for_each(value.begin(), value.end(), [&](int16_t s) { if (++n > 1) os << ' '; os << s; });
            strValue = os.str();
        }
        return strValue;
    }